

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deStringUtil.cpp
# Opt level: O0

void de::StringUtil_selfTest(void)

{
  char cVar1;
  deBool dVar2;
  size_type sVar3;
  reference pvVar4;
  int precision;
  bool bVar5;
  byte local_8e3;
  bool local_8e2;
  byte local_8e1;
  bool local_8e0;
  byte local_8df;
  bool local_8de;
  byte local_8c2;
  byte local_8aa;
  byte local_892;
  byte local_87a;
  bool local_862;
  bool local_84a;
  bool local_832;
  bool local_81a;
  bool local_803;
  byte local_7eb;
  byte local_7d3;
  byte local_7bb;
  bool local_7a3;
  bool local_78b;
  bool local_773;
  bool local_75b;
  bool local_742;
  bool local_731;
  bool local_729;
  bool local_71d;
  bool local_711;
  bool local_6e3;
  bool local_6d2;
  bool local_6ba;
  bool local_6ac;
  allocator<char> local_6a9;
  string local_6a8;
  byte local_683;
  byte local_682;
  allocator<char> local_681;
  string local_680;
  byte local_65b;
  byte local_65a;
  allocator<char> local_659;
  string local_658;
  byte local_633;
  byte local_632;
  allocator<char> local_631;
  string local_630;
  byte local_60b;
  byte local_60a;
  allocator<char> local_609;
  string local_608;
  byte local_5e3;
  byte local_5e2;
  allocator<char> local_5e1;
  string local_5e0;
  byte local_5bb;
  byte local_5ba;
  allocator<char> local_5b9;
  string local_5b8;
  byte local_593;
  byte local_592;
  allocator<char> local_591;
  string local_590;
  byte local_56b;
  byte local_56a;
  allocator<char> local_569;
  string local_568;
  byte local_543;
  byte local_542;
  allocator<char> local_541;
  string local_540;
  byte local_51b;
  byte local_51a;
  allocator<char> local_519;
  string local_518;
  byte local_4f3;
  byte local_4f2;
  allocator<char> local_4f1;
  string local_4f0;
  byte local_4cb;
  byte local_4ca;
  allocator<char> local_4c9;
  string local_4c8;
  byte local_4a3;
  byte local_4a2;
  allocator<char> local_4a1;
  string local_4a0;
  byte local_47b;
  byte local_47a;
  allocator<char> local_479;
  string local_478;
  byte local_453;
  byte local_452;
  allocator<char> local_451;
  string local_450;
  byte local_42b;
  byte local_42a;
  allocator<char> local_429;
  string local_428;
  byte local_403;
  byte local_402;
  allocator<char> local_401;
  string local_400;
  byte local_3db;
  byte local_3da;
  allocator<char> local_3d9;
  string local_3d8;
  byte local_3b3;
  byte local_3b2;
  allocator<char> local_3b1;
  string local_3b0;
  byte local_38b;
  byte local_38a;
  allocator<char> local_389;
  string local_388;
  byte local_363;
  byte local_362;
  allocator<char> local_361;
  string local_360;
  byte local_33b;
  byte local_33a;
  allocator<char> local_339;
  string local_338;
  byte local_313;
  byte local_312;
  allocator<char> local_311;
  string local_310;
  byte local_2eb;
  byte local_2ea;
  allocator<char> local_2e9;
  string local_2e8;
  byte local_2c3;
  byte local_2c2;
  allocator<char> local_2c1;
  string local_2c0;
  byte local_29b;
  byte local_29a;
  allocator<char> local_299;
  string local_298;
  byte local_273;
  byte local_272;
  allocator<char> local_271;
  string local_270;
  byte local_24b;
  byte local_24a;
  allocator<char> local_249;
  string local_248;
  byte local_223;
  byte local_222;
  allocator<char> local_221;
  string local_220;
  byte local_1fb;
  byte local_1fa;
  allocator<char> local_1f9;
  string local_1f8;
  byte local_1d3;
  byte local_1d2;
  allocator<char> local_1d1;
  string local_1d0;
  byte local_1ab;
  byte local_1aa;
  allocator<char> local_1a9;
  string local_1a8;
  byte local_183;
  byte local_182;
  allocator<char> local_181;
  string local_180;
  byte local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  undefined1 local_110 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string local_f0;
  string local_d0;
  byte local_ac;
  byte local_ab;
  byte local_aa;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  byte local_61;
  string local_60;
  byte local_2d;
  int local_2c;
  string local_28;
  
  do {
    dVar2 = ::deGetFalse();
    local_2d = 0;
    local_6ac = false;
    if (dVar2 == 0) {
      local_2c = 0x2a;
      toString<int>(&local_28,&local_2c);
      local_2d = 1;
      local_6ac = std::operator==(&local_28,"42");
    }
    if ((local_2d & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_28);
    }
    if (local_6ac == false) {
      deAssertFail("toString(42) == \"42\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xa1);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    local_61 = 0;
    local_6ba = false;
    if (dVar2 == 0) {
      toString<char[4]>(&local_60,(char (*) [4])0x3913b6);
      local_61 = 1;
      local_6ba = std::operator==(&local_60,"foo");
    }
    if ((local_61 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_60);
    }
    if (local_6ba == false) {
      deAssertFail("toString(\"foo\") == \"foo\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xa2);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    local_aa = 0;
    local_ab = 0;
    local_ac = 0;
    local_6d2 = false;
    if (dVar2 == 0) {
      std::allocator<char>::allocator();
      local_aa = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"FooBar",&local_a9);
      local_ab = 1;
      toLower(&local_88,&local_a8);
      local_ac = 1;
      local_6d2 = std::operator==(&local_88,"foobar");
    }
    if ((local_ac & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_88);
    }
    if ((local_ab & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_a8);
    }
    if ((local_aa & 1) != 0) {
      std::allocator<char>::~allocator(&local_a9);
    }
    if (local_6d2 == false) {
      deAssertFail("toLower(\"FooBar\") == \"foobar\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xa3);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
    tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
    local_6e3 = false;
    if (dVar2 == 0) {
      std::allocator<char>::allocator();
      tokens.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"FooBar",
                 (allocator<char> *)
                 ((long)&tokens.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      tokens.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
      toUpper(&local_d0,&local_f0);
      tokens.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 1;
      local_6e3 = std::operator==(&local_d0,"FOOBAR");
    }
    if ((tokens.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_d0);
    }
    if ((tokens.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_f0);
    }
    if ((tokens.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&tokens.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    }
    if (local_6e3 == false) {
      deAssertFail("toUpper(\"FooBar\") == \"FOOBAR\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xa4);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130," foo bar\n\tbaz   ",&local_131);
  splitString((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_110,&local_130,'\0');
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  do {
    dVar2 = ::deGetFalse();
    bVar5 = false;
    if (dVar2 == 0) {
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_110);
      bVar5 = sVar3 == 3;
    }
    if (!bVar5) {
      deAssertFail("tokens.size() == 3",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xa8);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    local_711 = false;
    if (dVar2 == 0) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_110,0);
      local_711 = std::operator==(pvVar4,"foo");
    }
    if (local_711 == false) {
      deAssertFail("tokens[0] == \"foo\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xa9);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    local_71d = false;
    if (dVar2 == 0) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_110,1);
      local_71d = std::operator==(pvVar4,"bar");
    }
    if (local_71d == false) {
      deAssertFail("tokens[1] == \"bar\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xaa);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    local_729 = false;
    if (dVar2 == 0) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_110,2);
      local_729 = std::operator==(pvVar4,"baz");
    }
    if (local_729 == false) {
      deAssertFail("tokens[2] == \"baz\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xab);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_110);
  do {
    dVar2 = ::deGetFalse();
    local_159 = 0;
    local_731 = false;
    if (dVar2 == 0) {
      floatToString_abi_cxx11_(&local_158,(de *)0x1,4.0,precision);
      local_159 = 1;
      local_731 = std::operator==(&local_158,"4.0");
    }
    if ((local_159 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_158);
    }
    if (local_731 == false) {
      deAssertFail("floatToString(4, 1) == \"4.0\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xae);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    local_182 = 0;
    local_183 = 0;
    local_1aa = 0;
    local_1ab = 0;
    local_742 = false;
    if (dVar2 == 0) {
      std::allocator<char>::allocator();
      local_182 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"foobar",&local_181);
      local_183 = 1;
      std::allocator<char>::allocator();
      local_1aa = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"foobar",&local_1a9);
      local_1ab = 1;
      local_742 = beginsWith(&local_180,&local_1a8);
    }
    if ((local_1ab & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1a8);
    }
    if ((local_1aa & 1) != 0) {
      std::allocator<char>::~allocator(&local_1a9);
    }
    if ((local_183 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_180);
    }
    if ((local_182 & 1) != 0) {
      std::allocator<char>::~allocator(&local_181);
    }
    if (local_742 == false) {
      deAssertFail("beginsWith(\"foobar\", \"foobar\")",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xb0);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    local_1d2 = 0;
    local_1d3 = 0;
    local_1fa = 0;
    local_1fb = 0;
    local_75b = false;
    if (dVar2 == 0) {
      std::allocator<char>::allocator();
      local_1d2 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"foobar",&local_1d1);
      local_1d3 = 1;
      std::allocator<char>::allocator();
      local_1fa = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"foo",&local_1f9);
      local_1fb = 1;
      local_75b = beginsWith(&local_1d0,&local_1f8);
    }
    if ((local_1fb & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1f8);
    }
    if ((local_1fa & 1) != 0) {
      std::allocator<char>::~allocator(&local_1f9);
    }
    if ((local_1d3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1d0);
    }
    if ((local_1d2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_1d1);
    }
    if (local_75b == false) {
      deAssertFail("beginsWith(\"foobar\", \"foo\")",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xb1);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    local_222 = 0;
    local_223 = 0;
    local_24a = 0;
    local_24b = 0;
    local_773 = false;
    if (dVar2 == 0) {
      std::allocator<char>::allocator();
      local_222 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"foobar",&local_221);
      local_223 = 1;
      std::allocator<char>::allocator();
      local_24a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"f",&local_249);
      local_24b = 1;
      local_773 = beginsWith(&local_220,&local_248);
    }
    if ((local_24b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_248);
    }
    if ((local_24a & 1) != 0) {
      std::allocator<char>::~allocator(&local_249);
    }
    if ((local_223 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_220);
    }
    if ((local_222 & 1) != 0) {
      std::allocator<char>::~allocator(&local_221);
    }
    if (local_773 == false) {
      deAssertFail("beginsWith(\"foobar\", \"f\")",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xb2);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    local_272 = 0;
    local_273 = 0;
    local_29a = 0;
    local_29b = 0;
    local_78b = false;
    if (dVar2 == 0) {
      std::allocator<char>::allocator();
      local_272 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"foobar",&local_271);
      local_273 = 1;
      std::allocator<char>::allocator();
      local_29a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"",&local_299);
      local_29b = 1;
      local_78b = beginsWith(&local_270,&local_298);
    }
    if ((local_29b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_298);
    }
    if ((local_29a & 1) != 0) {
      std::allocator<char>::~allocator(&local_299);
    }
    if ((local_273 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_270);
    }
    if ((local_272 & 1) != 0) {
      std::allocator<char>::~allocator(&local_271);
    }
    if (local_78b == false) {
      deAssertFail("beginsWith(\"foobar\", \"\")",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xb3);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    local_2c2 = 0;
    local_2c3 = 0;
    local_2ea = 0;
    local_2eb = 0;
    local_7a3 = false;
    if (dVar2 == 0) {
      std::allocator<char>::allocator();
      local_2c2 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"",&local_2c1);
      local_2c3 = 1;
      std::allocator<char>::allocator();
      local_2ea = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"",&local_2e9);
      local_2eb = 1;
      local_7a3 = beginsWith(&local_2c0,&local_2e8);
    }
    if ((local_2eb & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_2e8);
    }
    if ((local_2ea & 1) != 0) {
      std::allocator<char>::~allocator(&local_2e9);
    }
    if ((local_2c3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_2c0);
    }
    if ((local_2c2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_2c1);
    }
    if (local_7a3 == false) {
      deAssertFail("beginsWith(\"\", \"\")",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xb4);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    local_312 = 0;
    local_313 = 0;
    local_33a = 0;
    local_33b = 0;
    local_7bb = 0;
    if (dVar2 == 0) {
      std::allocator<char>::allocator();
      local_312 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"foobar",&local_311);
      local_313 = 1;
      std::allocator<char>::allocator();
      local_33a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"bar",&local_339);
      local_33b = 1;
      bVar5 = beginsWith(&local_310,&local_338);
      local_7bb = bVar5 ^ 0xff;
    }
    if ((local_33b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_338);
    }
    if ((local_33a & 1) != 0) {
      std::allocator<char>::~allocator(&local_339);
    }
    if ((local_313 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_310);
    }
    if ((local_312 & 1) != 0) {
      std::allocator<char>::~allocator(&local_311);
    }
    if ((local_7bb & 1) == 0) {
      deAssertFail("!beginsWith(\"foobar\", \"bar\")",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xb5);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    local_362 = 0;
    local_363 = 0;
    local_38a = 0;
    local_38b = 0;
    local_7d3 = 0;
    if (dVar2 == 0) {
      std::allocator<char>::allocator();
      local_362 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"foobar",&local_361);
      local_363 = 1;
      std::allocator<char>::allocator();
      local_38a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_388,"foobarbaz",&local_389);
      local_38b = 1;
      bVar5 = beginsWith(&local_360,&local_388);
      local_7d3 = bVar5 ^ 0xff;
    }
    if ((local_38b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_388);
    }
    if ((local_38a & 1) != 0) {
      std::allocator<char>::~allocator(&local_389);
    }
    if ((local_363 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_360);
    }
    if ((local_362 & 1) != 0) {
      std::allocator<char>::~allocator(&local_361);
    }
    if ((local_7d3 & 1) == 0) {
      deAssertFail("!beginsWith(\"foobar\", \"foobarbaz\")",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xb6);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    local_3b2 = 0;
    local_3b3 = 0;
    local_3da = 0;
    local_3db = 0;
    local_7eb = 0;
    if (dVar2 == 0) {
      std::allocator<char>::allocator();
      local_3b2 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"",&local_3b1);
      local_3b3 = 1;
      std::allocator<char>::allocator();
      local_3da = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"foo",&local_3d9);
      local_3db = 1;
      bVar5 = beginsWith(&local_3b0,&local_3d8);
      local_7eb = bVar5 ^ 0xff;
    }
    if ((local_3db & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_3d8);
    }
    if ((local_3da & 1) != 0) {
      std::allocator<char>::~allocator(&local_3d9);
    }
    if ((local_3b3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_3b0);
    }
    if ((local_3b2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_3b1);
    }
    if ((local_7eb & 1) == 0) {
      deAssertFail("!beginsWith(\"\", \"foo\")",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xb7);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    local_402 = 0;
    local_403 = 0;
    local_42a = 0;
    local_42b = 0;
    local_803 = false;
    if (dVar2 == 0) {
      std::allocator<char>::allocator();
      local_402 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"foobar",&local_401);
      local_403 = 1;
      std::allocator<char>::allocator();
      local_42a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"foobar",&local_429);
      local_42b = 1;
      local_803 = endsWith(&local_400,&local_428);
    }
    if ((local_42b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_428);
    }
    if ((local_42a & 1) != 0) {
      std::allocator<char>::~allocator(&local_429);
    }
    if ((local_403 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_400);
    }
    if ((local_402 & 1) != 0) {
      std::allocator<char>::~allocator(&local_401);
    }
    if (local_803 == false) {
      deAssertFail("endsWith(\"foobar\", \"foobar\")",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xb9);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    local_452 = 0;
    local_453 = 0;
    local_47a = 0;
    local_47b = 0;
    local_81a = false;
    if (dVar2 == 0) {
      std::allocator<char>::allocator();
      local_452 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"foobar",&local_451);
      local_453 = 1;
      std::allocator<char>::allocator();
      local_47a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_478,"bar",&local_479);
      local_47b = 1;
      local_81a = endsWith(&local_450,&local_478);
    }
    if ((local_47b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_478);
    }
    if ((local_47a & 1) != 0) {
      std::allocator<char>::~allocator(&local_479);
    }
    if ((local_453 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_450);
    }
    if ((local_452 & 1) != 0) {
      std::allocator<char>::~allocator(&local_451);
    }
    if (local_81a == false) {
      deAssertFail("endsWith(\"foobar\", \"bar\")",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xba);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    local_4a2 = 0;
    local_4a3 = 0;
    local_4ca = 0;
    local_4cb = 0;
    local_832 = false;
    if (dVar2 == 0) {
      std::allocator<char>::allocator();
      local_4a2 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,"foobar",&local_4a1);
      local_4a3 = 1;
      std::allocator<char>::allocator();
      local_4ca = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"r",&local_4c9);
      local_4cb = 1;
      local_832 = endsWith(&local_4a0,&local_4c8);
    }
    if ((local_4cb & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_4c8);
    }
    if ((local_4ca & 1) != 0) {
      std::allocator<char>::~allocator(&local_4c9);
    }
    if ((local_4a3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_4a0);
    }
    if ((local_4a2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_4a1);
    }
    if (local_832 == false) {
      deAssertFail("endsWith(\"foobar\", \"r\")",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xbb);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    local_4f2 = 0;
    local_4f3 = 0;
    local_51a = 0;
    local_51b = 0;
    local_84a = false;
    if (dVar2 == 0) {
      std::allocator<char>::allocator();
      local_4f2 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"foobar",&local_4f1);
      local_4f3 = 1;
      std::allocator<char>::allocator();
      local_51a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_518,"",&local_519);
      local_51b = 1;
      local_84a = endsWith(&local_4f0,&local_518);
    }
    if ((local_51b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_518);
    }
    if ((local_51a & 1) != 0) {
      std::allocator<char>::~allocator(&local_519);
    }
    if ((local_4f3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_4f0);
    }
    if ((local_4f2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_4f1);
    }
    if (local_84a == false) {
      deAssertFail("endsWith(\"foobar\", \"\")",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xbc);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    local_542 = 0;
    local_543 = 0;
    local_56a = 0;
    local_56b = 0;
    local_862 = false;
    if (dVar2 == 0) {
      std::allocator<char>::allocator();
      local_542 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_540,"",&local_541);
      local_543 = 1;
      std::allocator<char>::allocator();
      local_56a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_568,"",&local_569);
      local_56b = 1;
      local_862 = endsWith(&local_540,&local_568);
    }
    if ((local_56b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_568);
    }
    if ((local_56a & 1) != 0) {
      std::allocator<char>::~allocator(&local_569);
    }
    if ((local_543 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_540);
    }
    if ((local_542 & 1) != 0) {
      std::allocator<char>::~allocator(&local_541);
    }
    if (local_862 == false) {
      deAssertFail("endsWith(\"\", \"\")",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xbd);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    local_592 = 0;
    local_593 = 0;
    local_5ba = 0;
    local_5bb = 0;
    local_87a = 0;
    if (dVar2 == 0) {
      std::allocator<char>::allocator();
      local_592 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_590,"foobar",&local_591);
      local_593 = 1;
      std::allocator<char>::allocator();
      local_5ba = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b8,"foo",&local_5b9);
      local_5bb = 1;
      bVar5 = endsWith(&local_590,&local_5b8);
      local_87a = bVar5 ^ 0xff;
    }
    if ((local_5bb & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_5b8);
    }
    if ((local_5ba & 1) != 0) {
      std::allocator<char>::~allocator(&local_5b9);
    }
    if ((local_593 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_590);
    }
    if ((local_592 & 1) != 0) {
      std::allocator<char>::~allocator(&local_591);
    }
    if ((local_87a & 1) == 0) {
      deAssertFail("!endsWith(\"foobar\", \"foo\")",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xbe);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    local_5e2 = 0;
    local_5e3 = 0;
    local_60a = 0;
    local_60b = 0;
    local_892 = 0;
    if (dVar2 == 0) {
      std::allocator<char>::allocator();
      local_5e2 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e0,"foobar",&local_5e1);
      local_5e3 = 1;
      std::allocator<char>::allocator();
      local_60a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_608,"bazfoobar",&local_609);
      local_60b = 1;
      bVar5 = endsWith(&local_5e0,&local_608);
      local_892 = bVar5 ^ 0xff;
    }
    if ((local_60b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_608);
    }
    if ((local_60a & 1) != 0) {
      std::allocator<char>::~allocator(&local_609);
    }
    if ((local_5e3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_5e0);
    }
    if ((local_5e2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_5e1);
    }
    if ((local_892 & 1) == 0) {
      deAssertFail("!endsWith(\"foobar\", \"bazfoobar\")",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xbf);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    local_632 = 0;
    local_633 = 0;
    local_65a = 0;
    local_65b = 0;
    local_8aa = 0;
    if (dVar2 == 0) {
      std::allocator<char>::allocator();
      local_632 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_630,"foobar",&local_631);
      local_633 = 1;
      std::allocator<char>::allocator();
      local_65a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_658,"foobarbaz",&local_659);
      local_65b = 1;
      bVar5 = endsWith(&local_630,&local_658);
      local_8aa = bVar5 ^ 0xff;
    }
    if ((local_65b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_658);
    }
    if ((local_65a & 1) != 0) {
      std::allocator<char>::~allocator(&local_659);
    }
    if ((local_633 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_630);
    }
    if ((local_632 & 1) != 0) {
      std::allocator<char>::~allocator(&local_631);
    }
    if ((local_8aa & 1) == 0) {
      deAssertFail("!endsWith(\"foobar\", \"foobarbaz\")",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xc0);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    local_682 = 0;
    local_683 = 0;
    local_8c2 = 0;
    if (dVar2 == 0) {
      std::allocator<char>::allocator();
      local_682 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_680,"",&local_681);
      local_683 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a8,"foo",&local_6a9);
      bVar5 = endsWith(&local_680,&local_6a8);
      local_8c2 = bVar5 ^ 0xff;
    }
    if (dVar2 == 0) {
      std::__cxx11::string::~string((string *)&local_6a8);
      std::allocator<char>::~allocator(&local_6a9);
    }
    if ((local_683 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_680);
    }
    if ((local_682 & 1) != 0) {
      std::allocator<char>::~allocator(&local_681);
    }
    if ((local_8c2 & 1) == 0) {
      deAssertFail("!endsWith(\"\", \"foo\")",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xc1);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    bVar5 = false;
    if (dVar2 == 0) {
      cVar1 = toUpper('a');
      bVar5 = cVar1 == 'A';
    }
    if (!bVar5) {
      deAssertFail("toUpper(\'a\') == \'A\'",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xc3);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    bVar5 = false;
    if (dVar2 == 0) {
      cVar1 = toUpper('A');
      bVar5 = cVar1 == 'A';
    }
    if (!bVar5) {
      deAssertFail("toUpper(\'A\') == \'A\'",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xc4);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    bVar5 = false;
    if (dVar2 == 0) {
      cVar1 = toLower('a');
      bVar5 = cVar1 == 'a';
    }
    if (!bVar5) {
      deAssertFail("toLower(\'a\') == \'a\'",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xc5);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    bVar5 = false;
    if (dVar2 == 0) {
      cVar1 = toLower('A');
      bVar5 = cVar1 == 'a';
    }
    if (!bVar5) {
      deAssertFail("toLower(\'A\') == \'a\'",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xc6);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    local_8de = false;
    if (dVar2 == 0) {
      local_8de = isUpper('A');
    }
    if (local_8de == false) {
      deAssertFail("isUpper(\'A\')",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,199);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    local_8df = 0;
    if (dVar2 == 0) {
      bVar5 = isUpper('a');
      local_8df = bVar5 ^ 0xff;
    }
    if ((local_8df & 1) == 0) {
      deAssertFail("!isUpper(\'a\')",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,200);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    local_8e0 = false;
    if (dVar2 == 0) {
      local_8e0 = isLower('a');
    }
    if (local_8e0 == false) {
      deAssertFail("isLower(\'a\')",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xc9);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    local_8e1 = 0;
    if (dVar2 == 0) {
      bVar5 = isLower('A');
      local_8e1 = bVar5 ^ 0xff;
    }
    if ((local_8e1 & 1) == 0) {
      deAssertFail("!isLower(\'A\')",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xca);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    local_8e2 = false;
    if (dVar2 == 0) {
      local_8e2 = isDigit('0');
    }
    if (local_8e2 == false) {
      deAssertFail("isDigit(\'0\')",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xcb);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar2 = ::deGetFalse();
    local_8e3 = 0;
    if (dVar2 == 0) {
      bVar5 = isDigit('a');
      local_8e3 = bVar5 ^ 0xff;
    }
    if ((local_8e3 & 1) == 0) {
      deAssertFail("!isDigit(\'a\')",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deStringUtil.cpp"
                   ,0xcc);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  return;
}

Assistant:

void StringUtil_selfTest (void)
{

	DE_TEST_ASSERT(toString(42) == "42");
	DE_TEST_ASSERT(toString("foo") == "foo");
	DE_TEST_ASSERT(toLower("FooBar") == "foobar");
	DE_TEST_ASSERT(toUpper("FooBar") == "FOOBAR");

	{
		vector <string> tokens(splitString(" foo bar\n\tbaz   "));
		DE_TEST_ASSERT(tokens.size() == 3);
		DE_TEST_ASSERT(tokens[0] == "foo");
		DE_TEST_ASSERT(tokens[1] == "bar");
		DE_TEST_ASSERT(tokens[2] == "baz");
	}

	DE_TEST_ASSERT(floatToString(4, 1) == "4.0");

	DE_TEST_ASSERT(beginsWith("foobar", "foobar"));
	DE_TEST_ASSERT(beginsWith("foobar", "foo"));
	DE_TEST_ASSERT(beginsWith("foobar", "f"));
	DE_TEST_ASSERT(beginsWith("foobar", ""));
	DE_TEST_ASSERT(beginsWith("", ""));
	DE_TEST_ASSERT(!beginsWith("foobar", "bar"));
	DE_TEST_ASSERT(!beginsWith("foobar", "foobarbaz"));
	DE_TEST_ASSERT(!beginsWith("", "foo"));

	DE_TEST_ASSERT(endsWith("foobar", "foobar"));
	DE_TEST_ASSERT(endsWith("foobar", "bar"));
	DE_TEST_ASSERT(endsWith("foobar", "r"));
	DE_TEST_ASSERT(endsWith("foobar", ""));
	DE_TEST_ASSERT(endsWith("", ""));
	DE_TEST_ASSERT(!endsWith("foobar", "foo"));
	DE_TEST_ASSERT(!endsWith("foobar", "bazfoobar"));
	DE_TEST_ASSERT(!endsWith("foobar", "foobarbaz"));
	DE_TEST_ASSERT(!endsWith("", "foo"));

	DE_TEST_ASSERT(toUpper('a') == 'A');
	DE_TEST_ASSERT(toUpper('A') == 'A');
	DE_TEST_ASSERT(toLower('a') == 'a');
	DE_TEST_ASSERT(toLower('A') == 'a');
	DE_TEST_ASSERT(isUpper('A'));
	DE_TEST_ASSERT(!isUpper('a'));
	DE_TEST_ASSERT(isLower('a'));
	DE_TEST_ASSERT(!isLower('A'));
	DE_TEST_ASSERT(isDigit('0'));
	DE_TEST_ASSERT(!isDigit('a'));
}